

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_row_layout(nk_context *ctx,nk_layout_format fmt,float height,int cols,int width)

{
  nk_window *win;
  nk_panel *pnVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x45c4,
                  "void nk_row_layout(struct nk_context *, enum nk_layout_format, float, int, int)")
    ;
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    if (win->layout != (nk_panel *)0x0) {
      nk_panel_layout(ctx,win,height,cols);
      pnVar1 = win->layout;
      (pnVar1->row).type = (uint)(fmt != NK_DYNAMIC) << 2;
      (pnVar1->row).ratio = (float *)0x0;
      (pnVar1->row).item_offset = 0.0;
      (pnVar1->row).filled = 0.0;
      (pnVar1->row).item_width = (float)width;
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x45c6,
                  "void nk_row_layout(struct nk_context *, enum nk_layout_format, float, int, int)")
    ;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x45c5,
                "void nk_row_layout(struct nk_context *, enum nk_layout_format, float, int, int)");
}

Assistant:

NK_INTERN void
nk_row_layout(struct nk_context *ctx, enum nk_layout_format fmt,
    float height, int cols, int width)
{
    /* update the current row and set the current row layout */
    struct nk_window *win;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    nk_panel_layout(ctx, win, height, cols);
    if (fmt == NK_DYNAMIC)
        win->layout->row.type = NK_LAYOUT_DYNAMIC_FIXED;
    else win->layout->row.type = NK_LAYOUT_STATIC_FIXED;

    win->layout->row.ratio = 0;
    win->layout->row.filled = 0;
    win->layout->row.item_offset = 0;
    win->layout->row.item_width = (float)width;
}